

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

void deqp::gles3::Performance::anon_unknown_1::generateLayeredGridVertexAttribData4C4V
               (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertexData,
               LayeredGridSpec *scene)

{
  undefined4 uVar1;
  undefined4 uVar3;
  pointer pVVar2;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  undefined8 *puVar15;
  float in_XMM4_Db;
  float in_XMM5_Db;
  float fVar16;
  float fVar20;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar23;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0x3f80000000000000;
  uStack_30 = 0x3f33333300000000;
  local_48 = 0x3f8000003f800000;
  uStack_40 = 0x3f4ccccd00000000;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (vertexData,(long)(scene->gridWidth * scene->gridHeight * scene->gridLayers * 0xc));
  iVar11 = scene->gridHeight;
  if (0 < iVar11) {
    iVar14 = scene->gridWidth;
    iVar12 = 0;
    do {
      iVar10 = iVar12 + 1;
      if (0 < iVar14) {
        iVar11 = scene->gridLayers;
        iVar13 = 0;
        do {
          if (0 < iVar11) {
            iVar14 = 0;
            do {
              puVar15 = &local_48;
              if ((iVar12 + iVar13 + iVar14 & 1U) == 0) {
                puVar15 = &local_38;
              }
              uVar1 = scene->gridWidth;
              uVar3 = scene->gridHeight;
              auVar18._4_4_ = (float)iVar10;
              auVar18._0_4_ = (float)iVar13;
              auVar18._8_4_ = in_XMM4_Db;
              auVar18._12_4_ = 0;
              uVar9 = puVar15[1];
              auVar5._4_4_ = (float)(int)uVar3;
              auVar5._0_4_ = (float)(int)uVar1;
              auVar5._8_8_ = 0;
              auVar19 = divps(auVar18,auVar5);
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       ((uVar1 * iVar12 + iVar13) * iVar11 + iVar14) * 0xc;
              *(undefined8 *)pVVar2->m_data = *puVar15;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar9;
              fVar16 = auVar19._0_4_ + -0.5;
              fVar20 = auVar19._4_4_ + -0.5;
              fVar16 = fVar16 + fVar16;
              fVar20 = fVar20 + fVar20;
              uVar17 = CONCAT44(fVar20,fVar16);
              auVar19._8_4_ = 0;
              auVar19._0_8_ = uVar17;
              auVar19._12_4_ = 0x3f800000;
              *(undefined1 (*) [16])
               (vertexData->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start
               [((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc + 1].
               m_data = auVar19;
              uVar9 = puVar15[1];
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc +
                       2);
              *(undefined8 *)pVVar2->m_data = *puVar15;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar9;
              iVar11 = ((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc + 3
              ;
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              auVar22._4_4_ = (float)iVar12;
              auVar22._0_4_ = (float)(iVar13 + 1);
              auVar22._8_4_ = in_XMM5_Db;
              auVar22._12_4_ = 0;
              auVar6._4_4_ = (float)(int)uVar3;
              auVar6._0_4_ = (float)(int)uVar1;
              auVar6._8_8_ = 0;
              auVar19 = divps(auVar22,auVar6);
              pVVar2[iVar11].m_data[0] = fVar16;
              fVar16 = auVar19._0_4_ + -0.5;
              fVar23 = auVar19._4_4_ + -0.5;
              fVar16 = fVar16 + fVar16;
              fVar23 = fVar23 + fVar23;
              uVar21 = CONCAT44(fVar23,fVar16);
              pVVar2[iVar11].m_data[2] = 0.0;
              pVVar2[iVar11].m_data[3] = 1.0;
              pVVar2[iVar11].m_data[1] = fVar23;
              uVar9 = puVar15[1];
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc +
                       4);
              *(undefined8 *)pVVar2->m_data = *puVar15;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar9;
              auVar7._8_4_ = 0;
              auVar7._0_8_ = uVar21;
              auVar7._12_4_ = 0x3f800000;
              *(undefined1 (*) [16])
               (vertexData->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start
               [((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc + 5].
               m_data = auVar7;
              uVar9 = puVar15[1];
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc +
                       6);
              *(undefined8 *)pVVar2->m_data = *puVar15;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar9;
              auVar4._8_4_ = 0;
              auVar4._0_8_ = uVar17;
              auVar4._12_4_ = 0x3f800000;
              *(undefined1 (*) [16])
               (vertexData->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start
               [((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc + 7].
               m_data = auVar4;
              uVar9 = puVar15[1];
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc +
                       8);
              *(undefined8 *)pVVar2->m_data = *puVar15;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar9;
              auVar8._8_4_ = 0;
              auVar8._0_8_ = uVar21;
              auVar8._12_4_ = 0x3f800000;
              *(undefined1 (*) [16])
               (vertexData->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start
               [((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc + 9].
               m_data = auVar8;
              uVar9 = puVar15[1];
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start +
                       (((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc +
                       10);
              *(undefined8 *)pVVar2->m_data = *puVar15;
              *(undefined8 *)(pVVar2->m_data + 2) = uVar9;
              iVar11 = ((scene->gridWidth * iVar12 + iVar13) * scene->gridLayers + iVar14) * 0xc +
                       0xb;
              pVVar2 = (vertexData->
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pVVar2[iVar11].m_data[0] = fVar16;
              pVVar2[iVar11].m_data[1] = fVar20;
              pVVar2[iVar11].m_data[2] = 0.0;
              pVVar2[iVar11].m_data[3] = 1.0;
              iVar14 = iVar14 + 1;
              iVar11 = scene->gridLayers;
            } while (iVar14 < iVar11);
            iVar14 = scene->gridWidth;
            in_XMM4_Db = (float)iVar10;
            in_XMM5_Db = (float)iVar12;
          }
          iVar13 = iVar13 + 1;
        } while (iVar13 < iVar14);
        iVar11 = scene->gridHeight;
      }
      iVar12 = iVar10;
    } while (iVar10 < iVar11);
  }
  return;
}

Assistant:

static void generateLayeredGridVertexAttribData4C4V (std::vector<tcu::Vec4>& vertexData, const LayeredGridSpec& scene)
{
	// interleave color & vertex data
	const tcu::Vec4 green	(0.0f, 1.0f, 0.0f, 0.7f);
	const tcu::Vec4 yellow	(1.0f, 1.0f, 0.0f, 0.8f);

	vertexData.resize(getLayeredGridNumVertices(scene) * 2);

	for (int cellY = 0; cellY < scene.gridHeight; ++cellY)
	for (int cellX = 0; cellX < scene.gridWidth; ++cellX)
	for (int cellZ = 0; cellZ < scene.gridLayers; ++cellZ)
	{
		const tcu::Vec4	color		= (((cellX + cellY + cellZ) % 2) == 0) ? (green) : (yellow);
		const float		cellLeft	= (float(cellX  ) / (float)scene.gridWidth  - 0.5f) * 2.0f;
		const float		cellRight	= (float(cellX+1) / (float)scene.gridWidth  - 0.5f) * 2.0f;
		const float		cellTop		= (float(cellY+1) / (float)scene.gridHeight - 0.5f) * 2.0f;
		const float		cellBottom	= (float(cellY  ) / (float)scene.gridHeight - 0.5f) * 2.0f;

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  0] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  1] = tcu::Vec4(cellLeft, cellTop, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  2] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  3] = tcu::Vec4(cellLeft, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  4] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  5] = tcu::Vec4(cellRight, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  6] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  7] = tcu::Vec4(cellLeft, cellTop, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  8] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 +  9] = tcu::Vec4(cellRight, cellBottom, 0.0f, 1.0f);

		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 + 10] = color;
		vertexData[(cellY * scene.gridWidth * scene.gridLayers + cellX * scene.gridLayers + cellZ) * 12 + 11] = tcu::Vec4(cellRight, cellTop, 0.0f, 1.0f);
	}
}